

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

MP<45UL,_GF2::MOLex<45UL>_> * __thiscall
GF2::MP<45UL,_GF2::MOLex<45UL>_>::operator=
          (MP<45UL,_GF2::MOLex<45UL>_> *this,MP<45UL,_GF2::MOLex<45UL>_> *polyRight)

{
  if (polyRight != this) {
    std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::operator=
              (&this->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>,
               &polyRight->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>);
  }
  return this;
}

Assistant:

MP& operator=(const MP& polyRight)
	{	
		if (&polyRight != this)
		{
			std::list<MM<_n>>::operator=(polyRight);
			// нормализация без присваивания порядка!
			if (!IsConsistent(polyRight))
				Normalize();
		}
		return *this;
	}